

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O2

void Llb_ManPrepareVarMap(Llb_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  void *pvVar6;
  Aig_Man_t *pAVar7;
  int iVar8;
  char *__assertion;
  
  if (p->vNs2Glo == (Vec_Int_t *)0x0) {
    if (p->vCs2Glo == (Vec_Int_t *)0x0) {
      if (p->vGlo2Cs == (Vec_Int_t *)0x0) {
        if (p->vGlo2Ns == (Vec_Int_t *)0x0) {
          pVVar4 = Vec_IntStartFull(p->vVar2Obj->nSize);
          p->vNs2Glo = pVVar4;
          pVVar4 = Vec_IntStartFull(p->vVar2Obj->nSize);
          p->vCs2Glo = pVVar4;
          pVVar4 = Vec_IntStartFull(p->pAig->nRegs);
          p->vGlo2Cs = pVVar4;
          pVVar4 = Vec_IntStartFull(p->pAig->nRegs);
          p->vGlo2Ns = pVVar4;
          iVar8 = 0;
          while( true ) {
            pAVar7 = p->pAig;
            if (pAVar7->nRegs <= iVar8) {
              for (iVar8 = 0; iVar8 < pAVar7->nTruePis; iVar8 = iVar8 + 1) {
                pvVar5 = Vec_PtrEntry(pAVar7->vCis,iVar8);
                iVar2 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar5 + 0x24));
                Vec_IntWriteEntry(p->vCs2Glo,iVar2,p->pAig->nRegs + iVar8);
                Vec_IntWriteEntry(p->vNs2Glo,iVar2,p->pAig->nRegs + iVar8);
                pAVar7 = p->pAig;
              }
              return;
            }
            pvVar5 = Vec_PtrEntry(pAVar7->vCos,pAVar7->nTruePos + iVar8);
            pvVar6 = Vec_PtrEntry(p->pAig->vCis,p->pAig->nTruePis + iVar8);
            iVar2 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar5 + 0x24));
            uVar3 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar6 + 0x24));
            if ((iVar2 < 0) || (uVar1 = p->vVar2Obj->nSize, (int)uVar1 <= iVar2)) break;
            if (((int)uVar3 < 0) || (uVar1 <= uVar3)) {
              __assertion = "iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj)";
              uVar3 = 0x3e;
              goto LAB_00683e2c;
            }
            Vec_IntWriteEntry(p->vNs2Glo,iVar2,iVar8);
            Vec_IntWriteEntry(p->vCs2Glo,uVar3,iVar8);
            Vec_IntWriteEntry(p->vGlo2Cs,iVar8,uVar3);
            Vec_IntWriteEntry(p->vGlo2Ns,iVar8,iVar2);
            iVar8 = iVar8 + 1;
          }
          __assertion = "iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj)";
          uVar3 = 0x3d;
        }
        else {
          __assertion = "p->vGlo2Ns == NULL";
          uVar3 = 0x34;
        }
      }
      else {
        __assertion = "p->vGlo2Cs == NULL";
        uVar3 = 0x33;
      }
    }
    else {
      __assertion = "p->vCs2Glo == NULL";
      uVar3 = 0x32;
    }
  }
  else {
    __assertion = "p->vNs2Glo == NULL";
    uVar3 = 0x31;
  }
LAB_00683e2c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                ,uVar3,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_ManPrepareVarMap( Llb_Man_t * p )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, iVarLi, iVarLo;
    assert( p->vNs2Glo == NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vNs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vCs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
    {
        iVarLi = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLi));
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        assert( iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj) );
        assert( iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj) );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLi, i );
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarLo );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarLi );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObjLo, i )
    {
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
    }
}